

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O2

void __thiscall
Inline::WrapArgsOutWithCoerse(Inline *this,BuiltinFunction builtInId,Instr *callInstr)

{
  Instr *pIVar1;
  code *pcVar2;
  bool bVar3;
  ArgSlot AVar4;
  undefined4 *puVar5;
  SymOpnd *pSVar6;
  StackSym *pSVar7;
  Instr *pIVar8;
  intptr_t iVar9;
  AddrOpnd *pAVar10;
  Opnd *pOVar11;
  int iVar12;
  
  if (builtInId._value == '@') {
    if (callInstr->m_opcode != CallDirect) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x1a6,"(this->m_opcode == Js::OpCode::CallDirect)",
                         "this->m_opcode == Js::OpCode::CallDirect");
      if (!bVar3) goto LAB_00508214;
      *puVar5 = 0;
    }
    pSVar6 = IR::Opnd::AsSymOpnd(callInstr->m_src2);
    pSVar7 = Sym::AsStackSym(pSVar6->m_sym);
    pIVar1 = (pSVar7->field_5).m_instrDef;
    if (pIVar1->m_opcode != ArgOut_A_InlineSpecialized) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x1ad,"(tmpInstr->m_opcode == Js::OpCode::ArgOut_A_InlineSpecialized)",
                         "tmpInstr->m_opcode == Js::OpCode::ArgOut_A_InlineSpecialized");
      if (!bVar3) {
LAB_00508214:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    pOVar11 = pIVar1->m_src2;
    pSVar6 = IR::Opnd::AsSymOpnd(pOVar11);
    pSVar7 = Sym::AsStackSym(pSVar6->m_sym);
    AVar4 = StackSym::GetArgSlotNum(pSVar7);
    if (AVar4 == 2) {
      iVar12 = -1;
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      while( true ) {
        bVar3 = IR::Opnd::IsSymOpnd(pOVar11);
        if ((iVar12 == 1) || (!bVar3)) break;
        pSVar6 = IR::Opnd::AsSymOpnd(pOVar11);
        pSVar7 = Sym::AsStackSym(pSVar6->m_sym);
        if ((pSVar7->field_0x18 & 1) == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar5 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                             ,0x1bc,"(sym->m_isSingleDef)","sym->m_isSingleDef");
          if (!bVar3) goto LAB_00508214;
          *puVar5 = 0;
        }
        pIVar1 = (pSVar7->field_5).m_instrDef;
        if (pIVar1->m_opcode != ArgOut_A) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar5 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                             ,0x1be,"(argInstr->m_opcode == Js::OpCode::ArgOut_A)",
                             "argInstr->m_opcode == Js::OpCode::ArgOut_A");
          if (!bVar3) goto LAB_00508214;
          *puVar5 = 0;
        }
        if (iVar12 == 0) {
          pIVar8 = IR::Instr::HoistSrc1(pIVar1,Coerce_Regex,RegNOREG,(StackSym *)0x0);
        }
        else {
          pIVar8 = IR::Instr::HoistSrc1(pIVar1,Conv_Str,RegNOREG,(StackSym *)0x0);
          IR::Opnd::SetValueType(pIVar8->m_dst,(ValueType)0x800);
          IR::Opnd::SetValueType(pIVar1->m_src1,(ValueType)0x800);
        }
        IR::Instr::SetByteCodeOffset(pIVar8,pIVar1);
        pIVar8->field_0x37 = pIVar8->field_0x37 | 2;
        pOVar11 = pIVar1->m_src2;
        iVar12 = iVar12 + 1;
      }
    }
  }
  else if (builtInId._value == '\x11') {
    if (callInstr->m_opcode != CallDirect) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x1a6,"(this->m_opcode == Js::OpCode::CallDirect)",
                         "this->m_opcode == Js::OpCode::CallDirect");
      if (!bVar3) goto LAB_00508214;
      *puVar5 = 0;
    }
    pSVar6 = IR::Opnd::AsSymOpnd(callInstr->m_src2);
    pSVar7 = Sym::AsStackSym(pSVar6->m_sym);
    pIVar1 = (pSVar7->field_5).m_instrDef;
    if (pIVar1->m_opcode != ArgOut_A_InlineSpecialized) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x1ad,"(tmpInstr->m_opcode == Js::OpCode::ArgOut_A_InlineSpecialized)",
                         "tmpInstr->m_opcode == Js::OpCode::ArgOut_A_InlineSpecialized");
      if (!bVar3) goto LAB_00508214;
      *puVar5 = 0;
    }
    pOVar11 = pIVar1->m_src2;
    pSVar6 = IR::Opnd::AsSymOpnd(pOVar11);
    pSVar7 = Sym::AsStackSym(pSVar6->m_sym);
    AVar4 = StackSym::GetArgSlotNum(pSVar7);
    if (AVar4 == 3) {
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      iVar12 = 3;
      while( true ) {
        bVar3 = IR::Opnd::IsSymOpnd(pOVar11);
        if ((iVar12 == 0) || (!bVar3)) break;
        pSVar6 = IR::Opnd::AsSymOpnd(pOVar11);
        pSVar7 = Sym::AsStackSym(pSVar6->m_sym);
        if ((pSVar7->field_0x18 & 1) == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar5 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                             ,0x1bc,"(sym->m_isSingleDef)","sym->m_isSingleDef");
          if (!bVar3) goto LAB_00508214;
          *puVar5 = 0;
        }
        pIVar1 = (pSVar7->field_5).m_instrDef;
        if (pIVar1->m_opcode != ArgOut_A) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar5 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                             ,0x1be,"(argInstr->m_opcode == Js::OpCode::ArgOut_A)",
                             "argInstr->m_opcode == Js::OpCode::ArgOut_A");
          if (!bVar3) goto LAB_00508214;
          *puVar5 = 0;
        }
        if (iVar12 == 2) {
          pIVar8 = IR::Instr::HoistSrc1(pIVar1,Coerce_StrOrRegex,RegNOREG,(StackSym *)0x0);
LAB_00507fbb:
          IR::Instr::SetByteCodeOffset(pIVar8,pIVar1);
          pIVar8->field_0x37 = pIVar8->field_0x37 | 2;
        }
        else if (iVar12 == 1) {
          pIVar8 = IR::Instr::HoistSrc1(pIVar1,Coerce_Str,RegNOREG,(StackSym *)0x0);
          IR::Opnd::SetValueType(pIVar8->m_dst,(ValueType)0x800);
          iVar9 = ThreadContextInfo::GetStringReplaceNameAddr(pIVar8->m_func->m_threadContextInfo);
          pAVar10 = IR::AddrOpnd::New(iVar9,AddrOpndKindSz,pIVar8->m_func,false,(Var)0x0);
          IR::Instr::SetSrc2(pIVar8,&pAVar10->super_Opnd);
          IR::Opnd::SetValueType(pIVar1->m_src1,(ValueType)0x800);
          goto LAB_00507fbb;
        }
        pOVar11 = pIVar1->m_src2;
        iVar12 = iVar12 + -1;
      }
    }
  }
  else if (builtInId._value == '\x10') {
    if (callInstr->m_opcode != CallDirect) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x1a6,"(this->m_opcode == Js::OpCode::CallDirect)",
                         "this->m_opcode == Js::OpCode::CallDirect");
      if (!bVar3) goto LAB_00508214;
      *puVar5 = 0;
    }
    pSVar6 = IR::Opnd::AsSymOpnd(callInstr->m_src2);
    pSVar7 = Sym::AsStackSym(pSVar6->m_sym);
    pIVar1 = (pSVar7->field_5).m_instrDef;
    if (pIVar1->m_opcode != ArgOut_A_InlineSpecialized) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x1ad,"(tmpInstr->m_opcode == Js::OpCode::ArgOut_A_InlineSpecialized)",
                         "tmpInstr->m_opcode == Js::OpCode::ArgOut_A_InlineSpecialized");
      if (!bVar3) goto LAB_00508214;
      *puVar5 = 0;
    }
    pOVar11 = pIVar1->m_src2;
    pSVar6 = IR::Opnd::AsSymOpnd(pOVar11);
    pSVar7 = Sym::AsStackSym(pSVar6->m_sym);
    AVar4 = StackSym::GetArgSlotNum(pSVar7);
    if (AVar4 == 2) {
      iVar12 = -1;
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      while( true ) {
        bVar3 = IR::Opnd::IsSymOpnd(pOVar11);
        if ((iVar12 == 1) || (!bVar3)) break;
        pSVar6 = IR::Opnd::AsSymOpnd(pOVar11);
        pSVar7 = Sym::AsStackSym(pSVar6->m_sym);
        if ((pSVar7->field_0x18 & 1) == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar5 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                             ,0x1bc,"(sym->m_isSingleDef)","sym->m_isSingleDef");
          if (!bVar3) goto LAB_00508214;
          *puVar5 = 0;
        }
        pIVar1 = (pSVar7->field_5).m_instrDef;
        if (pIVar1->m_opcode != ArgOut_A) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar5 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                             ,0x1be,"(argInstr->m_opcode == Js::OpCode::ArgOut_A)",
                             "argInstr->m_opcode == Js::OpCode::ArgOut_A");
          if (!bVar3) goto LAB_00508214;
          *puVar5 = 0;
        }
        if (iVar12 == 0) {
          pIVar8 = IR::Instr::HoistSrc1(pIVar1,Coerce_Str,RegNOREG,(StackSym *)0x0);
          IR::Opnd::SetValueType(pIVar8->m_dst,(ValueType)0x800);
          iVar9 = ThreadContextInfo::GetStringMatchNameAddr(pIVar8->m_func->m_threadContextInfo);
          pAVar10 = IR::AddrOpnd::New(iVar9,AddrOpndKindSz,pIVar8->m_func,false,(Var)0x0);
          IR::Instr::SetSrc2(pIVar8,&pAVar10->super_Opnd);
          IR::Opnd::SetValueType(pIVar1->m_src1,(ValueType)0x800);
        }
        else {
          pIVar8 = IR::Instr::HoistSrc1(pIVar1,Coerce_Regex,RegNOREG,(StackSym *)0x0);
        }
        IR::Instr::SetByteCodeOffset(pIVar8,pIVar1);
        pIVar8->field_0x37 = pIVar8->field_0x37 | 2;
        pOVar11 = pIVar1->m_src2;
        iVar12 = iVar12 + 1;
      }
    }
  }
  return;
}

Assistant:

void
Inline::WrapArgsOutWithCoerse(Js::BuiltinFunction builtInId, IR::Instr* callInstr)
{
    switch (builtInId)
    {
    case Js::BuiltinFunction::JavascriptString_Match:
        callInstr->ForEachCallDirectArgOutInstrBackward([&](IR::Instr *argOutInstr, uint argNum)
        {
            IR::Instr * newInstr = nullptr;
            bool isPreOpBailOutNeeded = false;
            if (argNum == 0)
            {
                newInstr = argOutInstr->HoistSrc1(Js::OpCode::Coerce_Str);
                isPreOpBailOutNeeded = true;
                newInstr->GetDst()->SetValueType(ValueType::String);
                newInstr->SetSrc2(IR::AddrOpnd::New(newInstr->m_func->GetThreadContextInfo()->GetStringMatchNameAddr(), IR::AddrOpndKindSz, newInstr->m_func));
                argOutInstr->GetSrc1()->SetValueType(ValueType::String);
            }
            else if (argNum == 1)
            {
                newInstr = argOutInstr->HoistSrc1(Js::OpCode::Coerce_Regex);
                isPreOpBailOutNeeded = true;
            }
            if (isPreOpBailOutNeeded)
            {
                newInstr->SetByteCodeOffset(argOutInstr);
                newInstr->forcePreOpBailOutIfNeeded = true;
            }
            return false;
        }, 2);
        break;

    case Js::BuiltinFunction::JavascriptString_Replace:
        callInstr->ForEachCallDirectArgOutInstrBackward([&](IR::Instr *argOutInstr, uint argNum)
        {
            IR::Instr * newInstr = nullptr;
            bool isPreOpBailOutNeeded = false;
            if (argNum == 0)
            {
                newInstr = argOutInstr->HoistSrc1(Js::OpCode::Coerce_Str);
                isPreOpBailOutNeeded = true;
                newInstr->GetDst()->SetValueType(ValueType::String);
                newInstr->SetSrc2(IR::AddrOpnd::New(newInstr->m_func->GetThreadContextInfo()->GetStringReplaceNameAddr(), IR::AddrOpndKindSz, newInstr->m_func));
                argOutInstr->GetSrc1()->SetValueType(ValueType::String);
            }
            if (argNum == 1)
            {
                newInstr = argOutInstr->HoistSrc1(Js::OpCode::Coerce_StrOrRegex);
                isPreOpBailOutNeeded = true;
            }
            if (isPreOpBailOutNeeded)
            {
                newInstr->SetByteCodeOffset(argOutInstr);
                newInstr->forcePreOpBailOutIfNeeded = true;
            }
            return false;
        }, 3);
        break;
    case Js::BuiltinFunction::JavascriptRegExp_Exec:
        callInstr->ForEachCallDirectArgOutInstrBackward([&](IR::Instr *argOutInstr, uint argNum)
        {
            IR::Instr * newInstr = nullptr;
            bool isPreOpBailOutNeeded = false;
            if (argNum == 0)
            {
                newInstr = argOutInstr->HoistSrc1(Js::OpCode::Coerce_Regex);
                isPreOpBailOutNeeded = true;
            }
            else if (argNum == 1)
            {
                newInstr = argOutInstr->HoistSrc1(Js::OpCode::Conv_Str);
                newInstr->GetDst()->SetValueType(ValueType::String);
                argOutInstr->GetSrc1()->SetValueType(ValueType::String);
                isPreOpBailOutNeeded = true;
            }
            if (isPreOpBailOutNeeded)
            {
                newInstr->SetByteCodeOffset(argOutInstr);
                newInstr->forcePreOpBailOutIfNeeded = true;
            }
            return false;
        }, 2);
        break;
    }
}